

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O2

bool ImGui_ImplGlfw_Init(GLFWwindow *window,bool install_callbacks,GlfwClientApi client_api)

{
  GLFWwindow *pGVar1;
  ImGuiIO *pIVar2;
  ImGuiViewport *pIVar3;
  ImGuiPlatformIO *pIVar4;
  ImGuiViewport *pIVar5;
  undefined7 in_register_00000031;
  
  g_Time = 0.0;
  g_Window = window;
  pIVar2 = ImGui::GetIO();
  pIVar2->BackendFlags = pIVar2->BackendFlags | 0x406;
  pIVar2->BackendPlatformName = "imgui_impl_glfw";
  pIVar2->KeyMap[0] = 0x102;
  pIVar2->KeyMap[1] = 0x107;
  pIVar2->KeyMap[2] = 0x106;
  pIVar2->KeyMap[3] = 0x109;
  pIVar2->KeyMap[4] = 0x108;
  pIVar2->KeyMap[5] = 0x10a;
  pIVar2->KeyMap[6] = 0x10b;
  pIVar2->KeyMap[7] = 0x10c;
  pIVar2->KeyMap[8] = 0x10d;
  pIVar2->KeyMap[9] = 0x104;
  pIVar2->KeyMap[10] = 0x105;
  pIVar2->KeyMap[0xb] = 0x103;
  pIVar2->KeyMap[0xc] = 0x20;
  pIVar2->KeyMap[0xd] = 0x101;
  pIVar2->KeyMap[0xe] = 0x100;
  pIVar2->KeyMap[0xf] = 0x14f;
  pIVar2->KeyMap[0x10] = 0x41;
  pIVar2->KeyMap[0x11] = 0x43;
  pIVar2->KeyMap[0x12] = 0x56;
  pIVar2->KeyMap[0x13] = 0x58;
  pIVar2->KeyMap[0x14] = 0x59;
  pIVar2->KeyMap[0x15] = 0x5a;
  pIVar2->SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
  pIVar2->GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
  pIVar2->ClipboardUserData = g_Window;
  g_MouseCursors[0] = glfwCreateStandardCursor(0x36001);
  g_MouseCursors[1] = glfwCreateStandardCursor(0x36002);
  g_MouseCursors[3] = glfwCreateStandardCursor(0x36006);
  g_MouseCursors[4] = glfwCreateStandardCursor(0x36005);
  g_MouseCursors[7] = glfwCreateStandardCursor(0x36004);
  g_MouseCursors[2] = glfwCreateStandardCursor(0x36009);
  g_MouseCursors[5] = glfwCreateStandardCursor(0x36008);
  g_MouseCursors[6] = glfwCreateStandardCursor(0x36007);
  g_MouseCursors[8] = glfwCreateStandardCursor(0x3600a);
  g_PrevUserCallbackMousebutton = (GLFWmousebuttonfun)0x0;
  g_PrevUserCallbackScroll = (GLFWscrollfun)0x0;
  g_PrevUserCallbackKey = (GLFWkeyfun)0x0;
  g_PrevUserCallbackChar = (GLFWcharfun)0x0;
  if ((int)CONCAT71(in_register_00000031,install_callbacks) != 0) {
    g_InstalledCallbacks = 1;
    g_PrevUserCallbackMousebutton =
         glfwSetMouseButtonCallback(window,ImGui_ImplGlfw_MouseButtonCallback);
    g_PrevUserCallbackScroll = glfwSetScrollCallback(window,ImGui_ImplGlfw_ScrollCallback);
    g_PrevUserCallbackKey = glfwSetKeyCallback(window,ImGui_ImplGlfw_KeyCallback);
    g_PrevUserCallbackChar = glfwSetCharCallback(window,ImGui_ImplGlfw_CharCallback);
  }
  pIVar3 = ImGui::GetMainViewport();
  pIVar3->PlatformHandle = g_Window;
  if ((pIVar2->ConfigFlags & 0x400) != 0) {
    pIVar4 = ImGui::GetPlatformIO();
    pIVar4->Platform_CreateWindow = ImGui_ImplGlfw_CreateWindow;
    pIVar4->Platform_DestroyWindow = ImGui_ImplGlfw_DestroyWindow;
    pIVar4->Platform_ShowWindow = ImGui_ImplGlfw_ShowWindow;
    pIVar4->Platform_SetWindowPos = ImGui_ImplGlfw_SetWindowPos;
    pIVar4->Platform_GetWindowPos = ImGui_ImplGlfw_GetWindowPos;
    pIVar4->Platform_SetWindowSize = ImGui_ImplGlfw_SetWindowSize;
    pIVar4->Platform_GetWindowSize = ImGui_ImplGlfw_GetWindowSize;
    pIVar4->Platform_SetWindowFocus = ImGui_ImplGlfw_SetWindowFocus;
    pIVar4->Platform_GetWindowFocus = ImGui_ImplGlfw_GetWindowFocus;
    pIVar4->Platform_GetWindowMinimized = ImGui_ImplGlfw_GetWindowMinimized;
    pIVar4->Platform_SetWindowTitle = ImGui_ImplGlfw_SetWindowTitle;
    pIVar4->Platform_RenderWindow = ImGui_ImplGlfw_RenderWindow;
    pIVar4->Platform_SwapBuffers = ImGui_ImplGlfw_SwapBuffers;
    pIVar4->Platform_SetWindowAlpha = ImGui_ImplGlfw_SetWindowAlpha;
    pIVar4->Platform_CreateVkSurface = ImGui_ImplGlfw_CreateVkSurface;
    ImGui_ImplGlfw_UpdateMonitors();
    glfwSetMonitorCallback(ImGui_ImplGlfw_MonitorCallback);
    pIVar5 = ImGui::GetMainViewport();
    pIVar3 = (ImGuiViewport *)ImGui::MemAlloc(0x10);
    (pIVar3->Pos).y = -NAN;
    pGVar1 = g_Window;
    *(GLFWwindow **)pIVar3 = g_Window;
    *(undefined1 *)&(pIVar3->Pos).x = 0;
    pIVar5->PlatformUserData = pIVar3;
    pIVar5->PlatformHandle = pGVar1;
  }
  g_ClientApi = client_api;
  return SUB81(pIVar3,0);
}

Assistant:

static bool ImGui_ImplGlfw_Init(GLFWwindow* window, bool install_callbacks, GlfwClientApi client_api)
{
    g_Window = window;
    g_Time = 0.0;

    // Setup back-end capabilities flags
    ImGuiIO& io = ImGui::GetIO();
    io.BackendFlags |= ImGuiBackendFlags_HasMouseCursors;         // We can honor GetMouseCursor() values (optional)
    io.BackendFlags |= ImGuiBackendFlags_HasSetMousePos;          // We can honor io.WantSetMousePos requests (optional, rarely used)
    io.BackendFlags |= ImGuiBackendFlags_PlatformHasViewports;    // We can create multi-viewports on the Platform side (optional)
#if GLFW_HAS_GLFW_HOVERED && defined(_WIN32)
    io.BackendFlags |= ImGuiBackendFlags_HasMouseHoveredViewport; // We can set io.MouseHoveredViewport correctly (optional, not easy)
#endif
    io.BackendPlatformName = "imgui_impl_glfw";

    // Keyboard mapping. ImGui will use those indices to peek into the io.KeysDown[] array.
    io.KeyMap[ImGuiKey_Tab] = GLFW_KEY_TAB;
    io.KeyMap[ImGuiKey_LeftArrow] = GLFW_KEY_LEFT;
    io.KeyMap[ImGuiKey_RightArrow] = GLFW_KEY_RIGHT;
    io.KeyMap[ImGuiKey_UpArrow] = GLFW_KEY_UP;
    io.KeyMap[ImGuiKey_DownArrow] = GLFW_KEY_DOWN;
    io.KeyMap[ImGuiKey_PageUp] = GLFW_KEY_PAGE_UP;
    io.KeyMap[ImGuiKey_PageDown] = GLFW_KEY_PAGE_DOWN;
    io.KeyMap[ImGuiKey_Home] = GLFW_KEY_HOME;
    io.KeyMap[ImGuiKey_End] = GLFW_KEY_END;
    io.KeyMap[ImGuiKey_Insert] = GLFW_KEY_INSERT;
    io.KeyMap[ImGuiKey_Delete] = GLFW_KEY_DELETE;
    io.KeyMap[ImGuiKey_Backspace] = GLFW_KEY_BACKSPACE;
    io.KeyMap[ImGuiKey_Space] = GLFW_KEY_SPACE;
    io.KeyMap[ImGuiKey_Enter] = GLFW_KEY_ENTER;
    io.KeyMap[ImGuiKey_Escape] = GLFW_KEY_ESCAPE;
    io.KeyMap[ImGuiKey_KeyPadEnter] = GLFW_KEY_KP_ENTER;
    io.KeyMap[ImGuiKey_A] = GLFW_KEY_A;
    io.KeyMap[ImGuiKey_C] = GLFW_KEY_C;
    io.KeyMap[ImGuiKey_V] = GLFW_KEY_V;
    io.KeyMap[ImGuiKey_X] = GLFW_KEY_X;
    io.KeyMap[ImGuiKey_Y] = GLFW_KEY_Y;
    io.KeyMap[ImGuiKey_Z] = GLFW_KEY_Z;

    io.SetClipboardTextFn = ImGui_ImplGlfw_SetClipboardText;
    io.GetClipboardTextFn = ImGui_ImplGlfw_GetClipboardText;
    io.ClipboardUserData = g_Window;

    g_MouseCursors[ImGuiMouseCursor_Arrow] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_TextInput] = glfwCreateStandardCursor(GLFW_IBEAM_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNS] = glfwCreateStandardCursor(GLFW_VRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeEW] = glfwCreateStandardCursor(GLFW_HRESIZE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_Hand] = glfwCreateStandardCursor(GLFW_HAND_CURSOR);
#if GLFW_HAS_NEW_CURSORS
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_RESIZE_ALL_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_RESIZE_NESW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_RESIZE_NWSE_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_NOT_ALLOWED_CURSOR);
#else
    g_MouseCursors[ImGuiMouseCursor_ResizeAll] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNESW] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_ResizeNWSE] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
    g_MouseCursors[ImGuiMouseCursor_NotAllowed] = glfwCreateStandardCursor(GLFW_ARROW_CURSOR);
#endif

    // Chain GLFW callbacks: our callbacks will call the user's previously installed callbacks, if any.
    g_PrevUserCallbackMousebutton = NULL;
    g_PrevUserCallbackScroll = NULL;
    g_PrevUserCallbackKey = NULL;
    g_PrevUserCallbackChar = NULL;
    if (install_callbacks)
    {
        g_InstalledCallbacks = true;
        g_PrevUserCallbackMousebutton = glfwSetMouseButtonCallback(window, ImGui_ImplGlfw_MouseButtonCallback);
        g_PrevUserCallbackScroll = glfwSetScrollCallback(window, ImGui_ImplGlfw_ScrollCallback);
        g_PrevUserCallbackKey = glfwSetKeyCallback(window, ImGui_ImplGlfw_KeyCallback);
        g_PrevUserCallbackChar = glfwSetCharCallback(window, ImGui_ImplGlfw_CharCallback);
    }

    // Our mouse update function expect PlatformHandle to be filled for the main viewport
    ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    main_viewport->PlatformHandle = (void*)g_Window;
#ifdef _WIN32
    main_viewport->PlatformHandleRaw = glfwGetWin32Window(g_Window);
#endif
    if (io.ConfigFlags & ImGuiConfigFlags_ViewportsEnable)
        ImGui_ImplGlfw_InitPlatformInterface();

    g_ClientApi = client_api;
    return true;
}